

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

void Spl_ManLutFanouts_rec
               (Gia_Man_t *p,int iObj,Vec_Int_t *vFanouts,Vec_Bit_t *vMarksNo,Vec_Bit_t *vMarksCIO)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Vec_BitEntry(vMarksNo,iObj);
  if (iVar1 == 0) {
    iVar1 = Vec_BitEntry(vMarksCIO,iObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsLut2(p,iObj);
      if (iVar1 != 0) {
        Vec_BitWriteEntry(vMarksCIO,iObj,1);
        Vec_IntPush(vFanouts,iObj);
        return;
      }
      iVar1 = 0;
      while( true ) {
        iVar2 = Gia_ObjFanoutNumId(p,iObj);
        if (iVar2 <= iVar1) break;
        iVar2 = Gia_ObjFanoutId(p,iObj,iVar1);
        Spl_ManLutFanouts_rec(p,iVar2,vFanouts,vMarksNo,vMarksCIO);
        iVar1 = iVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void Spl_ManLutFanouts_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vFanouts, Vec_Bit_t * vMarksNo, Vec_Bit_t * vMarksCIO )
{
    int iFanout, i;
    if ( Vec_BitEntry(vMarksNo, iObj) || Vec_BitEntry(vMarksCIO, iObj) )
        return;
    if ( Gia_ObjIsLut2(p, iObj) )
    {
        Vec_BitWriteEntry( vMarksCIO, iObj, 1 );
        Vec_IntPush( vFanouts, iObj );
        return;
    }
    Gia_ObjForEachFanoutStaticId( p, iObj, iFanout, i )
        Spl_ManLutFanouts_rec( p, iFanout, vFanouts, vMarksNo, vMarksCIO );
}